

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O2

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  uint _c;
  size_t _elemsize;
  uint uVar3;
  void *pvVar4;
  int i;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  float *pfVar15;
  int _w;
  int iVar16;
  int iVar17;
  long lVar18;
  int k;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  float fVar22;
  int local_154;
  Mat bottom_blob_bordered;
  Option opt_b;
  Mat local_98;
  long local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar12 = bottom_blob->w;
  iVar6 = bottom_blob->h;
  _c = bottom_blob->c;
  uVar9 = (ulong)_c;
  _elemsize = bottom_blob->elemsize;
  if (this->global_pooling != 0) {
    Mat::create(top_blob,_c,_elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar21 = iVar6 * iVar12;
    if (this->pooling_type == 1) {
      uVar3 = uVar21;
      if ((int)uVar21 < 1) {
        uVar3 = 0;
      }
      if ((int)_c < 1) {
        uVar9 = 0;
      }
      for (uVar13 = 0; uVar13 != uVar9; uVar13 = uVar13 + 1) {
        Mat::channel(&bottom_blob_bordered,bottom_blob,(int)uVar13);
        pvVar4 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        fVar22 = 0.0;
        for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
          fVar22 = fVar22 + *(float *)((long)pvVar4 + uVar7 * 4);
        }
        *(float *)((long)top_blob->data + uVar13 * 4) = fVar22 * (1.0 / (float)(int)uVar21);
      }
      return 0;
    }
    if (this->pooling_type != 0) {
      return 0;
    }
    if ((int)uVar21 < 1) {
      uVar21 = 0;
    }
    if ((int)_c < 1) {
      uVar9 = 0;
    }
    for (uVar13 = 0; uVar13 != uVar9; uVar13 = uVar13 + 1) {
      Mat::channel(&bottom_blob_bordered,bottom_blob,(int)uVar13);
      pvVar4 = bottom_blob_bordered.data;
      Mat::~Mat(&bottom_blob_bordered);
      fVar22 = *pvVar4;
      for (uVar7 = 0; uVar21 != uVar7; uVar7 = uVar7 + 1) {
        fVar2 = *(float *)((long)pvVar4 + uVar7 * 4);
        if (fVar22 <= fVar2) {
          fVar22 = fVar2;
        }
      }
      *(float *)((long)top_blob->data + uVar13 * 4) = fVar22;
    }
    return 0;
  }
  Mat::Mat(&bottom_blob_bordered,bottom_blob);
  if (this->pooling_type == 0) {
    fVar22 = -3.4028235e+38;
  }
  else {
    fVar22 = 0.0;
  }
  switch(this->pad_mode) {
  case 0:
    iVar19 = ((iVar12 + this->pad_left + this->pad_right) - this->kernel_w) % this->stride_w;
    iVar12 = ((iVar6 + this->pad_top + this->pad_bottom) - this->kernel_h) % this->stride_h;
    iVar10 = this->stride_w - iVar19;
    if (iVar19 == 0) {
      iVar10 = 0;
    }
    local_154 = this->stride_h - iVar12;
    if (iVar12 == 0) {
      local_154 = 0;
    }
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b._34_6_ = *(undefined6 *)&opt->field_0x22;
    opt_b.lightmode = opt->lightmode;
    opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.blob_allocator = opt->workspace_allocator;
    copy_make_border(bottom_blob,&bottom_blob_bordered,this->pad_top,this->pad_bottom + local_154,
                     this->pad_left,this->pad_right + iVar10,0,fVar22,&opt_b);
    if ((bottom_blob_bordered.data == (void *)0x0) ||
       (iVar12 = bottom_blob_bordered.w,
       (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) {
LAB_00134730:
      iVar5 = -100;
      goto LAB_00134e81;
    }
    goto LAB_0013474d;
  case 1:
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b._34_6_ = *(undefined6 *)&opt->field_0x22;
    opt_b.lightmode = opt->lightmode;
    opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.blob_allocator = opt->workspace_allocator;
    copy_make_border(bottom_blob,&bottom_blob_bordered,this->pad_top,this->pad_bottom,this->pad_left
                     ,this->pad_right,0,fVar22,&opt_b);
LAB_00134708:
    if ((bottom_blob_bordered.data == (void *)0x0) ||
       (iVar12 = bottom_blob_bordered.w, iVar6 = bottom_blob_bordered.h,
       (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) goto LAB_00134730;
    break;
  case 2:
    iVar19 = ~((iVar12 + -1) % this->stride_w) + this->kernel_w;
    iVar10 = ~((iVar6 + -1) % this->stride_h) + this->kernel_h;
    if ((0 < iVar19) ||
       (iVar12 = bottom_blob_bordered.w, iVar6 = bottom_blob_bordered.h, 0 < iVar10)) {
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b._34_6_ = *(undefined6 *)&opt->field_0x22;
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.blob_allocator = opt->workspace_allocator;
      copy_make_border(bottom_blob,&bottom_blob_bordered,iVar10 / 2,iVar10 - iVar10 / 2,iVar19 / 2,
                       iVar19 - iVar19 / 2,0,fVar22,&opt_b);
      goto LAB_00134708;
    }
    break;
  case 3:
    iVar19 = ~((iVar12 + -1) % this->stride_w) + this->kernel_w;
    iVar10 = ~((iVar6 + -1) % this->stride_h) + this->kernel_h;
    if ((0 < iVar19) ||
       (iVar12 = bottom_blob_bordered.w, iVar6 = bottom_blob_bordered.h, 0 < iVar10)) {
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b._34_6_ = *(undefined6 *)&opt->field_0x22;
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.blob_allocator = opt->workspace_allocator;
      copy_make_border(bottom_blob,&bottom_blob_bordered,iVar10 - iVar10 / 2,iVar10 / 2,
                       iVar19 - iVar19 / 2,iVar19 / 2,0,fVar22,&opt_b);
      goto LAB_00134708;
    }
  }
  local_154 = 0;
  iVar10 = 0;
  bottom_blob_bordered.h = iVar6;
LAB_0013474d:
  iVar6 = (iVar12 - this->kernel_w) / this->stride_w;
  uVar13 = (long)(bottom_blob_bordered.h - this->kernel_h) / (long)this->stride_h;
  uVar7 = uVar13 & 0xffffffff;
  _w = iVar6 + 1;
  iVar19 = (int)uVar13;
  Mat::create(top_blob,_w,iVar19 + 1,_c,_elemsize,opt->blob_allocator);
  iVar5 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar13 = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar13,(allocator_type *)&opt_b);
    iVar5 = this->kernel_w;
    iVar12 = iVar12 - iVar5;
    lVar8 = 0;
    iVar11 = 0;
    for (iVar16 = 0; iVar16 < this->kernel_h; iVar16 = iVar16 + 1) {
      for (lVar18 = 0; iVar17 = (int)lVar18, iVar17 < iVar5; lVar18 = lVar18 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar8 + lVar18] = iVar11 + iVar17;
        iVar5 = this->kernel_w;
      }
      iVar11 = iVar11 + iVar12 + iVar17;
      lVar8 = (int)lVar8 + lVar18;
    }
    lVar8 = (long)iVar6;
    iVar12 = (int)uVar13;
    if (this->pooling_type == 0) {
      uVar20 = 0;
      uVar13 = uVar13 & 0xffffffff;
      if (iVar12 < 1) {
        uVar13 = uVar20;
      }
      local_50 = uVar7;
      if ((int)_c < 1) {
        uVar9 = uVar20;
      }
      for (; iVar12 = bottom_blob_bordered.w, uVar20 != uVar9; uVar20 = uVar20 + 1) {
        opt_b._0_8_ = bottom_blob_bordered.cstep * uVar20 * bottom_blob_bordered.elemsize +
                      (long)bottom_blob_bordered.data;
        opt_b.blob_allocator = (Allocator *)0x0;
        opt_b.workspace_allocator = (Allocator *)bottom_blob_bordered.elemsize;
        opt_b.use_winograd_convolution = (bool)(undefined1)bottom_blob_bordered.elempack;
        opt_b.use_sgemm_convolution = (bool)bottom_blob_bordered.elempack._1_1_;
        opt_b.use_int8_inference = (bool)bottom_blob_bordered.elempack._2_1_;
        opt_b.use_vulkan_compute = (bool)bottom_blob_bordered.elempack._3_1_;
        opt_b._32_8_ = bottom_blob_bordered.allocator;
        Mat::channel(&local_98,top_blob,(int)uVar20);
        pfVar15 = (float *)local_98.data;
        Mat::~Mat(&local_98);
        for (iVar6 = 0; iVar6 <= (int)local_50; iVar6 = iVar6 + 1) {
          iVar10 = this->stride_h;
          iVar19 = this->stride_w;
          for (lVar18 = 0; lVar18 <= lVar8; lVar18 = lVar18 + 1) {
            pfVar1 = (float *)((long)iVar12 * (long)iVar6 * (long)iVar10 *
                               (long)opt_b.workspace_allocator + opt_b._0_8_ + lVar18 * iVar19 * 4);
            fVar22 = *pfVar1;
            for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
              fVar2 = pfVar1[_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar7]];
              if (fVar22 <= fVar2) {
                fVar22 = fVar2;
              }
            }
            pfVar15[lVar18] = fVar22;
          }
          pfVar15 = pfVar15 + _w;
        }
        Mat::~Mat((Mat *)&opt_b);
      }
    }
    else if (this->pooling_type == 1) {
      uVar7 = 0;
      uVar13 = uVar13 & 0xffffffff;
      if (iVar12 < 1) {
        uVar13 = uVar7;
      }
      if ((int)_c < 1) {
        uVar9 = uVar7;
      }
      local_58 = lVar8 * 4;
      for (; iVar6 = bottom_blob_bordered.w, uVar7 != uVar9; uVar7 = uVar7 + 1) {
        opt_b._0_8_ = bottom_blob_bordered.cstep * uVar7 * bottom_blob_bordered.elemsize +
                      (long)bottom_blob_bordered.data;
        opt_b.blob_allocator = (Allocator *)0x0;
        opt_b.workspace_allocator = (Allocator *)bottom_blob_bordered.elemsize;
        opt_b.use_winograd_convolution = (bool)(undefined1)bottom_blob_bordered.elempack;
        opt_b.use_sgemm_convolution = (bool)bottom_blob_bordered.elempack._1_1_;
        opt_b.use_int8_inference = (bool)bottom_blob_bordered.elempack._2_1_;
        opt_b.use_vulkan_compute = (bool)bottom_blob_bordered.elempack._3_1_;
        opt_b._32_8_ = bottom_blob_bordered.allocator;
        iVar11 = (int)uVar7;
        Mat::channel(&local_98,top_blob,iVar11);
        pfVar15 = (float *)local_98.data;
        Mat::~Mat(&local_98);
        for (iVar5 = 0; iVar5 <= iVar19; iVar5 = iVar5 + 1) {
          iVar16 = this->stride_h;
          iVar17 = this->stride_w;
          for (lVar18 = 0; lVar18 <= lVar8; lVar18 = lVar18 + 1) {
            fVar22 = 0.0;
            for (uVar20 = 0; uVar13 != uVar20; uVar20 = uVar20 + 1) {
              fVar22 = fVar22 + *(float *)((long)iVar6 * (long)iVar5 * (long)iVar16 *
                                           (long)opt_b.workspace_allocator + opt_b._0_8_ +
                                           lVar18 * iVar17 * 4 +
                                          (long)_space_ofs.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar20] * 4
                                          );
            }
            pfVar15[lVar18] = fVar22 * (1.0 / (float)iVar12);
          }
          pfVar15 = pfVar15 + _w;
        }
        if (this->avgpool_count_include_pad == 0) {
          iVar6 = this->pad_top;
          if (iVar6 != 0) {
            iVar5 = this->kernel_h;
            Mat::channel(&local_98,top_blob,iVar11);
            pvVar4 = local_98.data;
            Mat::~Mat(&local_98);
            for (lVar18 = 0; lVar18 <= lVar8; lVar18 = lVar18 + 1) {
              *(float *)((long)pvVar4 + lVar18 * 4) =
                   *(float *)((long)pvVar4 + lVar18 * 4) * (float)iVar5 *
                   (1.0 / (float)(iVar5 - iVar6));
            }
          }
          iVar6 = this->pad_bottom;
          if (iVar6 != -local_154) {
            iVar5 = this->kernel_h;
            Mat::channel(&local_98,top_blob,iVar11);
            pvVar4 = local_98.data;
            lVar14 = (long)(local_98.w * iVar19) * local_98.elemsize;
            Mat::~Mat(&local_98);
            for (lVar18 = 0; lVar18 <= lVar8; lVar18 = lVar18 + 1) {
              *(float *)((long)pvVar4 + lVar18 * 4 + lVar14) =
                   *(float *)((long)pvVar4 + lVar18 * 4 + lVar14) * (float)iVar5 *
                   (1.0 / (float)(iVar5 - (iVar6 + local_154)));
            }
          }
          iVar6 = this->pad_left;
          if (iVar6 != 0) {
            iVar5 = this->kernel_w;
            Mat::channel(&local_98,top_blob,iVar11);
            pfVar15 = (float *)local_98.data;
            Mat::~Mat(&local_98);
            for (iVar16 = 0; iVar16 <= iVar19; iVar16 = iVar16 + 1) {
              *pfVar15 = *pfVar15 * (float)iVar5 * (1.0 / (float)(iVar5 - iVar6));
              pfVar15 = pfVar15 + lVar8 + 1;
            }
          }
          iVar6 = this->pad_right;
          if (iVar6 != -iVar10) {
            iVar5 = this->kernel_w;
            Mat::channel(&local_98,top_blob,iVar11);
            pfVar15 = (float *)((long)local_98.data + local_58);
            Mat::~Mat(&local_98);
            for (iVar11 = 0; iVar11 <= iVar19; iVar11 = iVar11 + 1) {
              *pfVar15 = *pfVar15 * (float)iVar5 * (1.0 / (float)(iVar5 - (iVar6 + iVar10)));
              pfVar15 = pfVar15 + lVar8 + 1;
            }
          }
        }
        Mat::~Mat((Mat *)&opt_b);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    iVar5 = 0;
  }
LAB_00134e81:
  Mat::~Mat(&bottom_blob_bordered);
  return iVar5;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float sum = 0;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        sum += val;
                    }

                    outptr[j] = sum / maxk;
                }

                outptr += outw;
            }

            if (avgpool_count_include_pad == 0)
            {
                // fix pad
                if (pad_top != 0)
                {
                    const float scale = (float)kernel_h / (kernel_h - pad_top);

                    outptr = top_blob.channel(q).row(0);
                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] *= scale;
                    }
                }
                if (pad_bottom + htailpad != 0)
                {
                    const float scale = (float)kernel_h / (kernel_h - pad_bottom - htailpad);

                    outptr = top_blob.channel(q).row(outh - 1);
                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] *= scale;
                    }
                }
                if (pad_left != 0)
                {
                    const float scale = (float)kernel_w / (kernel_w - pad_left);

                    outptr = top_blob.channel(q);
                    for (int i = 0; i < outh; i++)
                    {
                        *outptr *= scale;
                        outptr += outw;
                    }
                }
                if (pad_right + wtailpad != 0)
                {
                    const float scale = (float)kernel_w / (kernel_w - pad_right - wtailpad);

                    outptr = top_blob.channel(q);
                    outptr += outw - 1;
                    for (int i = 0; i < outh; i++)
                    {
                        *outptr *= scale;
                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}